

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void __thiscall
EthBasePort::make_1394_header
          (EthBasePort *this,quadlet_t *packet,nodeid_t node,nodeaddr_t addr,uint tcode,uint tl)

{
  __uint32_t _Var1;
  uchar fw_pri;
  uint tl_local;
  uint tcode_local;
  nodeaddr_t addr_local;
  nodeid_t node_local;
  quadlet_t *packet_local;
  EthBasePort *this_local;
  
  _Var1 = __bswap_32((node & 0x3f | 0xffc0) << 0x10 | (tl & 0x3f) << 10 | (tcode & 0xf) << 4);
  *packet = _Var1;
  _Var1 = __bswap_32((uint)(addr >> 0x20) & 0xffff | 0xffd00000);
  packet[1] = _Var1;
  _Var1 = __bswap_32((__uint32_t)addr);
  packet[2] = _Var1;
  return;
}

Assistant:

void EthBasePort::make_1394_header(quadlet_t *packet, nodeid_t node, nodeaddr_t addr, unsigned int tcode,
                                   unsigned int tl)
{
    // FFC0 replicates the base node ID when using FireWire on PC. This is followed by a transaction
    // label (arbitrary value that is returned by any resulting FireWire packets) and the transaction code.
    unsigned char fw_pri = 0;
    packet[0] = bswap_32((0xFFC0 | (node&FW_NODE_MASK)) << 16 | (tl & 0x003F) << 10 | (tcode & 0x000F) << 4 | (fw_pri & 0x000F));
    // FFD0 is used as source ID (most significant 16 bits); this sets source node to 0x10 (16).
    // Previously, FFFF was used, which set the source node to 0x3f (63), which is the broadcast address.
    // This is followed by the destination address, which is 48-bits long
    packet[1] = bswap_32((0xFFD0 << 16) | ((addr & 0x0000FFFF00000000) >> 32));
    packet[2] = bswap_32(addr&0xFFFFFFFF);
}